

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_push.c
# Opt level: O3

ssize_t mpt_stream_push(mpt_stream *stream,size_t len,void *src)

{
  mpt_encode_queue *pmVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  char *__s;
  size_t sVar8;
  ulong local_50;
  
  uVar5 = mpt_stream_flags(&stream->_info);
  uVar4 = uVar5 & 0xffffffdf;
  if (-1 < (char)uVar5) {
    uVar4 = uVar5;
  }
  pmVar1 = &stream->_wd;
  local_50 = 0;
LAB_00107cbf:
  do {
    if (len == 0) {
      if ((stream->_wd)._enc != (mpt_data_encoder_t)0x0) {
        uVar6 = mpt_queue_push(pmVar1,0,0);
        if (-1 < (long)uVar6) {
          *(byte *)&(stream->_info)._fd = (byte)(stream->_info)._fd & 0xfb;
          return uVar6;
        }
        goto LAB_00107cfe;
      }
      sVar2 = (stream->_wd).data.len;
      sVar3 = (stream->_wd).data.max;
      __s = (char *)mpt_newline_string(uVar4 >> 0xe & 3);
      if (__s == (char *)0x0) {
LAB_00107dc7:
        mpt_queue_push(pmVar1,0,0);
        *(byte *)&(stream->_info)._fd = (byte)(stream->_info)._fd & 0xfb;
        return 0;
      }
      sVar8 = strlen(__s);
      if (sVar8 <= sVar3 - sVar2) {
        mpt_queue_push(pmVar1,sVar8,__s);
        goto LAB_00107dc7;
      }
    }
    else {
      uVar6 = mpt_queue_push(pmVar1,len,src);
      if (-1 < (long)uVar6) {
        *(byte *)&(stream->_info)._fd = (byte)(stream->_info)._fd | 4;
        local_50 = local_50 + uVar6;
        len = len - uVar6;
        if (len == 0) {
          return local_50;
        }
        src = (void *)((long)src + uVar6);
        goto LAB_00107cbf;
      }
LAB_00107cfe:
      if (uVar6 != 0xffffffffffffffef) goto LAB_00107d9d;
    }
    if ((uVar4 & 0xa0) != 0x20) {
      return -(ulong)(local_50 == 0) | local_50;
    }
    lVar7 = mpt_queue_prepare(pmVar1);
    if (lVar7 == 0) {
      uVar6 = 0xfffffffffffffffc;
LAB_00107d9d:
      if (local_50 != 0) {
        uVar6 = local_50;
      }
      return uVar6;
    }
  } while( true );
}

Assistant:

extern ssize_t mpt_stream_push(MPT_STRUCT(stream) *stream, size_t len, const void *src)
{
	ssize_t total = 0;
	int flags = mpt_stream_flags(&stream->_info);
	
	if (flags & MPT_STREAMFLAG(WriteMap)) {
		flags &= ~MPT_STREAMFLAG(WriteBuf);
	}
	
	while (1) {
		ssize_t post;
		
		/* error during data append */
		if (len) {
			post = mpt_queue_push(&stream->_wd, len, src);
		}
		/* terminate current message */
		else {
			if (!stream->_wd._enc) {
				const char *fmt;
				size_t add, rem;
				
				rem = stream->_wd.data.max - stream->_wd.data.len;
				fmt = mpt_newline_string(MPT_stream_newline_write(flags));
				add = fmt ? strlen(fmt) : 0;
				if (rem >= add) {
					if (fmt) {
						mpt_queue_push(&stream->_wd, add, fmt);
					}
					/* mark segment as done */
					mpt_queue_push(&stream->_wd, 0, 0);
					stream->_info._fd &= ~MPT_STREAMFLAG(MesgActive);
					return 0;
				}
				post = MPT_ERROR(MissingBuffer);
			}
			else if ((post = mpt_queue_push(&stream->_wd, 0, 0)) >= 0) {
				stream->_info._fd &= ~MPT_STREAMFLAG(MesgActive);
				return post;
			}
		}
		/* pushed some data */
		if (post >= 0) {
			stream->_info._fd |= MPT_STREAMFLAG(MesgActive);
			total += post;
			/* push operation finished */
			if (!(len -= post)) {
				return total;
			}
			src = ((uint8_t *) src) + post;
			continue;
		}
		/* incompatible error state */
		if (post != MPT_ERROR(MissingBuffer)) {
			return total ? total : post;
		}
		/* queue not resizable */
		if (!(flags & MPT_STREAMFLAG(WriteBuf))
		    || (flags & MPT_STREAMFLAG(WriteMap))) {
			return total ? total : MPT_ERROR(BadArgument);
		}
		/* append queue data */
		if (!mpt_queue_prepare(&stream->_wd.data, 256)) {
			return total ? total : MPT_ERROR(BadOperation);
		}
	}
}